

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::microfacet::sigma(microfacet *this,vec3 *wi,args *args)

{
  float_t fVar1;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar2;
  vec3 vVar3;
  undefined8 local_60;
  float_t local_58;
  undefined8 local_50;
  float_t local_48;
  float_t local_44;
  float_t fStack_40;
  float_t nrm;
  float_t local_38;
  undefined1 local_30 [8];
  vec3 wi_std;
  args *args_local;
  vec3 *wi_local;
  microfacet *this_local;
  
  unique0x100000a1 = args;
  vVar3 = djb::operator*(&args->minv,wi);
  local_38 = vVar3.z;
  wi_std.x = local_38;
  _fStack_40 = vVar3._0_8_;
  local_30._0_4_ = fStack_40;
  local_30._4_4_ = nrm;
  _fStack_40 = vVar3;
  fVar1 = dot((vec3 *)local_30,(vec3 *)local_30);
  dVar2 = std::sqrt((double)CONCAT44(extraout_XMM0_Db,fVar1));
  local_44 = SUB84(dVar2,0);
  vVar3 = djb::operator/((vec3 *)local_30,local_44);
  local_60 = vVar3._0_8_;
  local_50 = local_60;
  local_58 = vVar3.z;
  local_48 = local_58;
  (*(this->super_brdf)._vptr_brdf[10])(this,&local_50);
  return extraout_XMM0_Da * local_44;
}

Assistant:

float_t microfacet::sigma(const vec3 &wi, const args &args) const
{
	vec3 wi_std = args.minv * wi;
	float_t nrm = sqrt(dot(wi_std, wi_std));
	return sigma_std(wi_std / nrm) * nrm;
}